

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

void __thiscall
CServerBrowserFilter::Sort
          (CServerBrowserFilter *this,CServerEntry **ppServerlist,int NumServers,int ResortFlags)

{
  int iVar1;
  int iVar2;
  CServerFilter *pCVar3;
  uint in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  CServerFilter *in_RDI;
  CServerFilter *pFilter;
  int i;
  CServerFilter *in_stack_000000a8;
  int local_1c;
  
  *(undefined8 *)(in_RDI->m_FilterInfo).m_aAddress = in_RSI;
  *(undefined4 *)((in_RDI->m_FilterInfo).m_aAddress + 8) = in_EDX;
  local_1c = 0;
  do {
    iVar1 = array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
            ::size((array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
                    *)((in_RDI->m_FilterInfo).m_aGametype[7] + 8));
    if (iVar1 <= local_1c) {
      return;
    }
    pCVar3 = array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
             ::operator[]((array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
                           *)((in_RDI->m_FilterInfo).m_aGametype[7] + 8),local_1c);
    if (((in_ECX & 1) == 0) &&
       (((in_ECX & 2) == 0 || (((pCVar3->m_FilterInfo).m_SortHash & 0x400U) == 0)))) {
      iVar1 = (pCVar3->m_FilterInfo).m_SortHash;
      iVar2 = CServerFilter::GetSortHash(in_RDI);
      if (iVar1 != iVar2) goto LAB_0013a947;
    }
    else {
LAB_0013a947:
      CServerFilter::Sort(in_stack_000000a8);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void CServerBrowserFilter::Sort(CServerEntry **ppServerlist, int NumServers, int ResortFlags)
{
	m_ppServerlist = ppServerlist;
	m_NumServers = NumServers;
	for(int i = 0; i < m_lFilters.size(); i++)
	{
		// check if we need to resort
		CServerFilter *pFilter = &m_lFilters[i];
		if((ResortFlags&RESORT_FLAG_FORCE) || ((ResortFlags&RESORT_FLAG_FAV) && pFilter->m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE) || pFilter->m_FilterInfo.m_SortHash != pFilter->GetSortHash())
			pFilter->Sort();
	}
}